

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O0

QAMList * __thiscall OSTEI_VRR_Algorithm_Base::GetAMReq(OSTEI_VRR_Algorithm_Base *this,QAM *am)

{
  bool bVar1;
  RRStepType RVar2;
  vector<QAM,_std::allocator<QAM>_> *in_RDX;
  QAMList *in_RDI;
  QAM *it;
  iterator __end1;
  iterator __begin1;
  QAMList *__range1;
  QAMList req;
  RRStepType rrstep;
  QAMList *req2;
  undefined1 in_stack_00000bdb;
  RRStepType in_stack_00000bdc;
  QAM *in_stack_00000be0;
  OSTEI_VRR_Algorithm_Base *in_stack_00000be8;
  QAM *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  byte in_stack_fffffffffffffec7;
  value_type *__x;
  __normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> local_c0;
  undefined1 *local_b8;
  undefined1 local_a9;
  value_type local_a8;
  undefined1 local_78 [92];
  RRStepType local_1c;
  
  QAM::QAM((QAM *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
           in_stack_fffffffffffffeb8);
  RVar2 = GetRRStep((OSTEI_VRR_Algorithm_Base *)
                    CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                    in_stack_fffffffffffffeb8);
  QAM::~QAM((QAM *)0x11f6aa);
  __x = &local_a8;
  local_1c = RVar2;
  QAM::QAM((QAM *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
           in_stack_fffffffffffffeb8);
  GenerateAMReq(in_stack_00000be8,in_stack_00000be0,in_stack_00000bdc,(bool)in_stack_00000bdb);
  QAM::~QAM((QAM *)0x11f6fc);
  local_a9 = 0;
  std::vector<QAM,_std::allocator<QAM>_>::vector((vector<QAM,_std::allocator<QAM>_> *)0x11f70e);
  local_b8 = local_78;
  local_c0._M_current =
       (QAM *)std::vector<QAM,_std::allocator<QAM>_>::begin(in_stack_fffffffffffffeb8);
  std::vector<QAM,_std::allocator<QAM>_>::end
            ((vector<QAM,_std::allocator<QAM>_> *)in_stack_fffffffffffffeb8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                            CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                            (__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                            in_stack_fffffffffffffeb8), bVar1) {
    __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::operator*
              (&local_c0);
    QAM::QAM((QAM *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffec7 =
         ValidQAM((QAM *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    QAM::~QAM((QAM *)0x11f7a3);
    if ((in_stack_fffffffffffffec7 & 1) != 0) {
      std::vector<QAM,_std::allocator<QAM>_>::push_back(in_RDX,__x);
    }
    __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::operator++
              (&local_c0);
  }
  local_a9 = 1;
  std::vector<QAM,_std::allocator<QAM>_>::~vector(in_RDX);
  return in_RDI;
}

Assistant:

QAMList OSTEI_VRR_Algorithm_Base::GetAMReq(QAM am) const
{
    RRStepType rrstep = GetRRStep(am);
    QAMList req = GenerateAMReq(am, rrstep);

    // remove invalid quartets
    QAMList req2;
    for(const auto & it : req)
    {
        if(ValidQAM(it))
            req2.push_back(it);
    }

    return req2;
}